

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module-utils.cpp
# Opt level: O3

void __thiscall wasm::ModuleUtils::anon_unknown_4::TypeInfos::note(TypeInfos *this,Type type)

{
  _List_node_base **pp_Var1;
  pointer pHVar2;
  pair<std::_List_iterator<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>_>,_bool>
  pVar3;
  Type local_58;
  Type type_local;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> local_40;
  
  local_58.id = type.id;
  wasm::Type::getHeapTypeChildren(&local_40,&local_58);
  if (local_40.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_40.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pHVar2 = local_40.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      if (0x7c < pHVar2->id) {
        type_local.id = pHVar2->id;
        pVar3 = InsertOrderedMap<wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>::insert
                          (&this->info,
                           (pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo> *)
                           &type_local);
        pp_Var1 = &pVar3.first._M_node._M_node[1]._M_prev;
        *(int *)pp_Var1 = *(int *)pp_Var1 + 1;
      }
      pHVar2 = pHVar2 + 1;
    } while (pHVar2 != local_40.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                       _M_impl.super__Vector_impl_data._M_finish);
  }
  if (local_40.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_40.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_40.
                          super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_40.
                          super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void note(Type type) {
    for (HeapType ht : type.getHeapTypeChildren()) {
      note(ht);
    }
  }